

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidateDataStructure.cpp
# Opt level: O3

void __thiscall Assimp::ValidateDSProcess::ReportWarning(ValidateDSProcess *this,char *msg,...)

{
  char in_AL;
  uint uVar1;
  Logger *this_00;
  long *plVar2;
  undefined8 in_RCX;
  long *plVar3;
  undefined8 in_RDX;
  long *message;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  char szBuffer [3000];
  long local_cd8;
  long lStack_cd0;
  undefined1 *local_cc8 [2];
  undefined1 local_cb8 [16];
  undefined8 local_ca8;
  undefined1 *local_ca0;
  undefined1 *local_c98;
  undefined1 local_c88 [16];
  undefined8 local_c78;
  undefined8 local_c70;
  undefined8 local_c68;
  undefined8 local_c60;
  undefined4 local_c58;
  undefined8 local_c48;
  undefined8 local_c38;
  undefined8 local_c28;
  undefined8 local_c18;
  undefined8 local_c08;
  undefined8 local_bf8;
  undefined8 local_be8;
  char local_bd8 [3000];
  
  if (in_AL != '\0') {
    local_c58 = in_XMM0_Da;
    local_c48 = in_XMM1_Qa;
    local_c38 = in_XMM2_Qa;
    local_c28 = in_XMM3_Qa;
    local_c18 = in_XMM4_Qa;
    local_c08 = in_XMM5_Qa;
    local_bf8 = in_XMM6_Qa;
    local_be8 = in_XMM7_Qa;
  }
  local_c78 = in_RDX;
  local_c70 = in_RCX;
  local_c68 = in_R8;
  local_c60 = in_R9;
  if (msg != (char *)0x0) {
    local_c98 = local_c88;
    local_ca0 = &stack0x00000008;
    local_ca8 = 0x3000000010;
    uVar1 = vsprintf(local_bd8,msg,&local_ca8);
    if (0 < (int)uVar1) {
      this_00 = DefaultLogger::get();
      local_cc8[0] = local_cb8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_cc8,local_bd8,local_bd8 + uVar1);
      plVar2 = (long *)std::__cxx11::string::replace((ulong)local_cc8,0,(char *)0x0,0x1ee052);
      plVar3 = plVar2 + 2;
      if ((long *)*plVar2 == plVar3) {
        local_cd8 = *plVar3;
        lStack_cd0 = plVar2[3];
        message = &local_cd8;
      }
      else {
        local_cd8 = *plVar3;
        message = (long *)*plVar2;
      }
      *plVar2 = (long)plVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      Logger::warn(this_00,(char *)message);
      if (message != &local_cd8) {
        operator_delete(message);
      }
      if (local_cc8[0] != local_cb8) {
        operator_delete(local_cc8[0]);
      }
      return;
    }
    __assert_fail("iLen > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/PostProcessing/ValidateDataStructure.cpp"
                  ,0x68,"void Assimp::ValidateDSProcess::ReportWarning(const char *, ...)");
  }
  __assert_fail("__null != msg",
                "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/PostProcessing/ValidateDataStructure.cpp"
                ,0x61,"void Assimp::ValidateDSProcess::ReportWarning(const char *, ...)");
}

Assistant:

void ValidateDSProcess::ReportWarning(const char* msg,...)
{
    ai_assert(NULL != msg);

    va_list args;
    va_start(args,msg);

    char szBuffer[3000];
    const int iLen = vsprintf(szBuffer,msg,args);
    ai_assert(iLen > 0);

    va_end(args);
    ASSIMP_LOG_WARN("Validation warning: " + std::string(szBuffer,iLen));
}